

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeProperties(JUnitTestOutput *this)

{
  long *in_RDI;
  char *in_stack_ffffffffffffffb8;
  SimpleString *in_stack_ffffffffffffffc0;
  SimpleString *this_00;
  SimpleString local_28 [3];
  undefined1 local_10 [16];
  
  SimpleString::SimpleString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (**(code **)(*in_RDI + 0xc0))(in_RDI,local_10);
  SimpleString::~SimpleString((SimpleString *)0x20e5cb);
  this_00 = local_28;
  SimpleString::SimpleString(this_00,in_stack_ffffffffffffffb8);
  (**(code **)(*in_RDI + 0xc0))(in_RDI,this_00);
  SimpleString::~SimpleString((SimpleString *)0x20e603);
  return;
}

Assistant:

void JUnitTestOutput::writeProperties()
{
    writeToFile("<properties>\n");
    writeToFile("</properties>\n");
}